

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O2

void __thiscall DetailButton::DetailButton(DetailButton *this,QWidget *parent)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)&(this->super_QPushButton).super_QAbstractButton.super_QWidget =
       &PTR_metaObject_007dee78;
  *(undefined ***)&(this->super_QPushButton).super_QAbstractButton.super_QWidget.super_QPaintDevice
       = &PTR__DetailButton_007df048;
  label((QString *)&QStack_48,this,ShowLabel);
  QPushButton::QPushButton(&this->super_QPushButton,(QString *)&QStack_48,parent);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
  *(undefined ***)&(this->super_QPushButton).super_QAbstractButton.super_QWidget =
       &PTR_metaObject_007dee78;
  *(undefined ***)&(this->super_QPushButton).super_QAbstractButton.super_QWidget.super_QPaintDevice
       = &PTR__DetailButton_007df048;
  QWidget::setSizePolicy((QWidget *)this,(QSizePolicy)0x0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

DetailButton(QWidget *parent) : QPushButton(label(ShowLabel), parent)
    {
        setSizePolicy(QSizePolicy::Fixed, QSizePolicy::Fixed);
    }